

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_utility.cpp
# Opt level: O0

DecodeBase58ResponseStruct *
cfd::js::api::UtilStructApi::DecodeBase58
          (DecodeBase58ResponseStruct *__return_storage_ptr__,DecodeBase58RequestStruct *request)

{
  DecodeBase58RequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  DecodeBase58RequestStruct *pDStack_18;
  anon_class_1_0_00000001 call_func;
  DecodeBase58RequestStruct *request_local;
  DecodeBase58ResponseStruct *result;
  
  local_1a = 0;
  pDStack_18 = request;
  DecodeBase58ResponseStruct::DecodeBase58ResponseStruct(__return_storage_ptr__);
  this = pDStack_18;
  std::
  function<cfd::js::api::DecodeBase58ResponseStruct(cfd::js::api::DecodeBase58RequestStruct_const&)>
  ::
  function<cfd::js::api::UtilStructApi::DecodeBase58(cfd::js::api::DecodeBase58RequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::DecodeBase58ResponseStruct(cfd::js::api::DecodeBase58RequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"DecodeBase58",&local_129);
  ExecuteStructApi<cfd::js::api::DecodeBase58RequestStruct,cfd::js::api::DecodeBase58ResponseStruct>
            ((DecodeBase58ResponseStruct *)(local_108 + 0x20),(api *)this,
             (DecodeBase58RequestStruct *)local_108,&local_128,in_R8);
  DecodeBase58ResponseStruct::operator=
            (__return_storage_ptr__,(DecodeBase58ResponseStruct *)(local_108 + 0x20));
  DecodeBase58ResponseStruct::~DecodeBase58ResponseStruct
            ((DecodeBase58ResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
  ::~function((function<cfd::js::api::DecodeBase58ResponseStruct_(const_cfd::js::api::DecodeBase58RequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

DecodeBase58ResponseStruct UtilStructApi::DecodeBase58(
    const DecodeBase58RequestStruct& request) {
  auto call_func = [](const DecodeBase58RequestStruct& request)
      -> DecodeBase58ResponseStruct {
    DecodeBase58ResponseStruct result;
    ByteData data;
    if (request.has_checksum) {
      data = CryptoUtil::DecodeBase58Check(request.data);
    } else {
      data = CryptoUtil::DecodeBase58(request.data);
    }
    result.hex = data.GetHex();
    return result;
  };

  DecodeBase58ResponseStruct result;
  result =
      ExecuteStructApi<DecodeBase58RequestStruct, DecodeBase58ResponseStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}